

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::ChElementBeamTaperedTimoshenko
          (ChElementBeamTaperedTimoshenko *this)

{
  undefined1 auVar1 [64];
  int iVar2;
  int iVar3;
  undefined1 auVar4 [64];
  
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_01186748;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_0117d740;
  (this->super_ChElementBeam).mass = (double)SUB168(ZEXT416(0) << 0x40,0);
  (this->super_ChElementBeam).length = (double)SUB168(ZEXT416(0) << 0x40,8);
  this->super_ChLoadableUVW = (ChLoadableUVW)0x117dd78;
  this->super_ChLoadableU = (ChLoadableU)0x117de70;
  ChElementCorotational::ChElementCorotational(&this->super_ChElementCorotational);
  (this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase =
       (_func_int **)0x117d850;
  this->super_ChLoadableU = (ChLoadableU)0x117da40;
  this->super_ChLoadableUVW = (ChLoadableUVW)0x117db28;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0x117dbc0;
  (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tapered_section).
  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->tapered_section).
  super___shared_ptr<chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGeneric,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  auVar4 = vbroadcastf64x4_avx512f(_QUNIT);
  auVar1 = vmovdqu64_avx512f(auVar4);
  this->q_refrotA = (ChQuaternion<double>)auVar1._0_32_;
  this->q_refrotB = (ChQuaternion<double>)auVar1._32_32_;
  auVar1 = vmovdqu64_avx512f(auVar4);
  this->q_element_abs_rot = (ChQuaternion<double>)auVar1._0_32_;
  this->q_element_ref_rot = (ChQuaternion<double>)auVar1._32_32_;
  this->disable_corotate = false;
  this->force_symmetric_stiffness = false;
  this->use_geometric_stiffness = true;
  this->use_Rc = true;
  this->use_Rs = true;
  this->use_simplified_correction_for_inclined_shear_axis = false;
  (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->Rc).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  (this->Rs).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::resize(&this->nodes,2);
  iVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->Km).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             (long)iVar2,(long)iVar3);
  iVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->Kg).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             (long)iVar2,(long)iVar3);
  iVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar2
             ,(long)iVar3);
  iVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->Rm).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             (long)iVar2,(long)iVar3);
  iVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->Ri).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             (long)iVar2,(long)iVar3);
  iVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->Ki).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,
             (long)iVar2,(long)iVar3);
  iVar2 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  iVar3 = (*(this->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])(this);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            (&(this->T).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,(long)iVar2
             ,(long)iVar3);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&this->Rs,6,6);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&this->Rc,6,6);
  return;
}

Assistant:

ChElementBeamTaperedTimoshenko::ChElementBeamTaperedTimoshenko()
    : q_refrotA(QUNIT),
      q_refrotB(QUNIT),
      q_element_abs_rot(QUNIT),
      q_element_ref_rot(QUNIT),
      force_symmetric_stiffness(false),
      disable_corotate(false),
      use_geometric_stiffness(true),
      use_Rc(true),
      use_Rs(true) {
    nodes.resize(2);

    Km.setZero(this->GetNdofs(), this->GetNdofs());
    Kg.setZero(this->GetNdofs(), this->GetNdofs());
    M.setZero(this->GetNdofs(), this->GetNdofs());
    Rm.setZero(this->GetNdofs(), this->GetNdofs());
    Ri.setZero(this->GetNdofs(), this->GetNdofs());
    Ki.setZero(this->GetNdofs(), this->GetNdofs());

    T.setZero(this->GetNdofs(), this->GetNdofs());
    Rs.setIdentity(6, 6);
    Rc.setIdentity(6, 6);
}